

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstring.c
# Opt level: O2

pchar * p_strchomp(pchar *str)

{
  size_t sVar1;
  ushort **ppuVar2;
  pchar *ppVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (str != (pchar *)0x0) {
    sVar1 = strlen(str);
    uVar7 = sVar1 - 1;
    uVar4 = 0;
    uVar5 = 0;
    if (0 < (long)uVar7) {
      uVar5 = uVar7;
    }
    while ((uVar8 = uVar5, uVar5 != uVar4 &&
           (ppuVar2 = __ctype_b_loc(), uVar8 = uVar4,
           (*(byte *)((long)*ppuVar2 + (ulong)(byte)str[uVar4] * 2 + 1) & 0x20) != 0))) {
      uVar4 = uVar4 + 1;
    }
    uVar5 = (long)uVar7 >> 0x3f & uVar7;
    while ((uVar4 = uVar5, 0 < (long)uVar7 &&
           (ppuVar2 = __ctype_b_loc(), uVar4 = uVar7,
           (*(byte *)((long)*ppuVar2 + (ulong)(byte)str[uVar7] * 2 + 1) & 0x20) != 0))) {
      uVar7 = uVar7 - 1;
    }
    lVar6 = uVar4 - uVar8;
    if (((long)uVar4 < (long)uVar8) ||
       ((lVar6 == 0 &&
        (ppuVar2 = __ctype_b_loc(),
        (*(byte *)((long)*ppuVar2 + (ulong)(byte)str[uVar8] * 2 + 1) & 0x20) != 0)))) {
      ppVar3 = p_strdup("");
      return ppVar3;
    }
    ppVar3 = (pchar *)p_malloc0(lVar6 + 2);
    if (ppVar3 != (pchar *)0x0) {
      memcpy(ppVar3,str + uVar8,lVar6 + 1);
      ppVar3[lVar6 + 1] = '\0';
      return ppVar3;
    }
  }
  return (pchar *)0x0;
}

Assistant:

P_LIB_API pchar *
p_strchomp (const pchar *str)
{
	pssize		pos_start;
	pssize		pos_end;
	psize		str_len;
	pchar		*ret;
	const pchar	*ptr;

	if (P_UNLIKELY (str == NULL))
		return NULL;

	ptr       = str;
	pos_start = 0;
	pos_end   = ((pssize) strlen (str)) - 1;

	while (pos_start < pos_end && isspace (* ((const puchar *) ptr++)))
		++pos_start;

	ptr = str + pos_end;

	while (pos_end > 0 && isspace (* ((const puchar *) ptr--)))
		--pos_end;

	if (pos_end < pos_start)
		return p_strdup ("\0");

	if (pos_end == pos_start && isspace (* ((const puchar *) (str + pos_end))))
		return p_strdup ("\0");

	str_len = (psize) (pos_end - pos_start + 2);

	if (P_UNLIKELY ((ret = p_malloc0 (str_len)) == NULL))
		return NULL;

	memcpy (ret, str + pos_start, str_len - 1);
	*(ret + str_len - 1) = '\0';

	return ret;
}